

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O0

bool __thiscall
Js::EquivalentTypeSet::Contains(EquivalentTypeSet *this,JITTypeHolder type,uint16 *pIndex)

{
  bool bVar1;
  JITTypeHolderBase<void> local_38;
  ushort local_2a;
  uint16 *puStack_28;
  uint16 ti;
  uint16 *pIndex_local;
  EquivalentTypeSet *this_local;
  JITTypeHolder type_local;
  
  puStack_28 = pIndex;
  pIndex_local = (uint16 *)this;
  this_local = (EquivalentTypeSet *)type.t;
  bVar1 = GetSortedAndDuplicatesRemoved(this);
  if (!bVar1) {
    SortAndRemoveDuplicates(this);
  }
  local_2a = 0;
  while( true ) {
    if (this->count <= local_2a) {
      return false;
    }
    local_38.t = (Type)GetType(this,local_2a);
    bVar1 = JITTypeHolderBase<void>::operator==(&local_38,(JITTypeHolderBase<void> *)&this_local);
    if (bVar1) break;
    local_2a = local_2a + 1;
  }
  if (puStack_28 != (uint16 *)0x0) {
    *puStack_28 = local_2a;
  }
  return true;
}

Assistant:

bool EquivalentTypeSet::Contains(const JITTypeHolder type, uint16* pIndex)
{
    if (!this->GetSortedAndDuplicatesRemoved())
    {
        this->SortAndRemoveDuplicates();
    }
    for (uint16 ti = 0; ti < this->count; ti++)
    {
        if (this->GetType(ti) == type)
        {
            if (pIndex)
            {
                *pIndex = ti;
            }
            return true;
        }
    }
    return false;
}